

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

void __thiscall
pstore::command_line::
list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
list<char[6],pstore::command_line::details::positional>
          (list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *this,
          char (*mods) [6],positional *mods_1)

{
  option::option((option *)this,zero_or_more);
  *(undefined ***)this = &PTR__list_001ac610;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined ***)(this + 0x88) = &PTR__parser_001afd50;
  *(list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> **)
   (this + 0xb0) = this + 0xa8;
  *(list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> **)
   (this + 0xa8) = this + 0xa8;
  *(undefined8 *)(this + 0xb8) = 0;
  apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,char_const(&)[6],pstore::command_line::details::positional_const&>
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              *)this,mods,mods_1);
  return;
}

Assistant:

explicit list (Mods const &... mods)
                    : option (num_occurrences_flag::zero_or_more) {
                apply_to_option (*this, mods...);
            }